

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_descriptor_set_layout
               (StateRecorder *recorder,VkDescriptorSetLayoutCreateInfo *layout,Hash *out_hash)

{
  bool bVar1;
  Hash HVar2;
  uint64_t local_50;
  Hash hash;
  VkDescriptorSetLayoutBinding *pVStack_40;
  uint32_t j;
  VkDescriptorSetLayoutBinding *binding;
  uint32_t i;
  Hasher h;
  Hash *out_hash_local;
  VkDescriptorSetLayoutCreateInfo *layout_local;
  StateRecorder *recorder_local;
  
  h.h = (Hash)out_hash;
  Hasher::Hasher((Hasher *)&stack0xffffffffffffffd0);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd0,layout->bindingCount);
  Hasher::u32((Hasher *)&stack0xffffffffffffffd0,layout->flags);
  binding._4_4_ = 0;
  do {
    if (layout->bindingCount <= binding._4_4_) {
      bVar1 = hash_pnext_chain(recorder,(Hasher *)&stack0xffffffffffffffd0,layout->pNext,
                               (DynamicStateInfo *)0x0,0);
      if (bVar1) {
        HVar2 = Hasher::get((Hasher *)&stack0xffffffffffffffd0);
        *(Hash *)h.h = HVar2;
      }
      return bVar1;
    }
    pVStack_40 = layout->pBindings + binding._4_4_;
    Hasher::u32((Hasher *)&stack0xffffffffffffffd0,pVStack_40->binding);
    Hasher::u32((Hasher *)&stack0xffffffffffffffd0,pVStack_40->descriptorCount);
    Hasher::u32((Hasher *)&stack0xffffffffffffffd0,pVStack_40->descriptorType);
    Hasher::u32((Hasher *)&stack0xffffffffffffffd0,pVStack_40->stageFlags);
    if ((pVStack_40->pImmutableSamplers != (VkSampler *)0x0) &&
       ((pVStack_40->descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER ||
        (pVStack_40->descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER)))) {
      for (hash._4_4_ = 0; hash._4_4_ < pVStack_40->descriptorCount; hash._4_4_ = hash._4_4_ + 1) {
        bVar1 = StateRecorder::get_hash_for_sampler
                          (recorder,pVStack_40->pImmutableSamplers[hash._4_4_],&local_50);
        if (!bVar1) {
          return false;
        }
        Hasher::u64((Hasher *)&stack0xffffffffffffffd0,local_50);
      }
    }
    binding._4_4_ = binding._4_4_ + 1;
  } while( true );
}

Assistant:

bool compute_hash_descriptor_set_layout(const StateRecorder &recorder, const VkDescriptorSetLayoutCreateInfo &layout, Hash *out_hash)
{
	Hasher h;

	h.u32(layout.bindingCount);
	h.u32(layout.flags);
	for (uint32_t i = 0; i < layout.bindingCount; i++)
	{
		auto &binding = layout.pBindings[i];
		h.u32(binding.binding);
		h.u32(binding.descriptorCount);
		h.u32(binding.descriptorType);
		h.u32(binding.stageFlags);

		if (binding.pImmutableSamplers &&
			(binding.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER ||
		    binding.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER))
		{
			for (uint32_t j = 0; j < binding.descriptorCount; j++)
			{
				Hash hash;
				if (!recorder.get_hash_for_sampler(binding.pImmutableSamplers[j], &hash))
					return false;
				h.u64(hash);
			}
		}
	}

	if (!hash_pnext_chain(&recorder, h, layout.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}